

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int GetSentenceVector(void *hPtr,char *input,float **vector)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  element_type *peVar3;
  int64_t iVar4;
  real *__src;
  FastText *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  istream *in_RDI;
  size_t sz;
  float *vec;
  exception *e;
  istringstream inStream;
  Vector svec;
  FastTextWrapper *fastText;
  int64_t in_stack_fffffffffffffd78;
  Vector *in_stack_fffffffffffffd80;
  element_type *__dest;
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  allocator<char> local_1d9;
  string local_1d8 [32];
  istringstream local_1b8 [392];
  Vector *in_stack_ffffffffffffffd0;
  
  fasttext::FastText::getDimension((FastText *)0x1f329c);
  fasttext::Vector::Vector(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::__cxx11::istringstream::istringstream(local_1b8,local_1d8,_S_in);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  fasttext::FastText::getSentenceVector(in_RDX,in_RDI,in_stack_ffffffffffffffd0);
  uVar2 = fasttext::Vector::size((Vector *)0x1f3502);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  peVar3 = (element_type *)operator_new__(uVar2);
  iVar4 = fasttext::Vector::size((Vector *)0x1f3547);
  __dest = peVar3;
  __src = fasttext::Vector::data((Vector *)0x1f3573);
  memcpy(__dest,__src,iVar4 << 2);
  (in_RDX->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  iVar4 = fasttext::Vector::size((Vector *)0x1f35ab);
  std::__cxx11::istringstream::~istringstream(local_1b8);
  fasttext::Vector::~Vector((Vector *)0x1f35e1);
  return (int)iVar4;
}

Assistant:

GetSentenceVector(void* hPtr, const char* input, float** vector)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    Vector svec(fastText->getDimension());
    std::istringstream inStream(input);

    try {
        fastText->getSentenceVector(inStream, svec);
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    auto vec = new float[svec.size()];
    size_t sz = sizeof(float)*svec.size();
    memcpy(vec, svec.data(), sz);

    *vector = vec;

    return (int) svec.size();
}